

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImVec2 IVar1;
  float local_30;
  ImGuiWindow *window;
  float wrap_pos_x_local;
  ImVec2 *pos_local;
  
  if (0.0 <= wrap_pos_x) {
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      window._4_4_ = wrap_pos_x;
      if (0.0 < wrap_pos_x) {
        window._4_4_ = ((GImGui->CurrentWindow->Pos).x - (GImGui->CurrentWindow->Scroll).x) +
                       wrap_pos_x;
      }
    }
    else {
      IVar1 = GetWorkRectMax();
      local_30 = IVar1.x;
      window._4_4_ = local_30;
    }
    pos_local._4_4_ = ImMax<float>(window._4_4_ - pos->x,1.0);
  }
  else {
    pos_local._4_4_ = 0.0;
  }
  return pos_local._4_4_;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GImGui->CurrentWindow;
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = GetWorkRectMax().x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}